

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool IsBIP30Unspendable(CBlockIndex *block_index)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  base_blob<256U> local_98;
  base_blob<256U> local_78;
  base_blob<256U> local_58;
  base_blob<256U> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = block_index->nHeight;
  if (iVar3 == 0x1664a) {
    CBlockIndex::GetBlockHash((uint256 *)&local_38,block_index);
    local_58.m_data._M_elems[0] = 0x8e;
    local_58.m_data._M_elems[1] = 0xd0;
    local_58.m_data._M_elems[2] = 'M';
    local_58.m_data._M_elems[3] = 'W';
    local_58.m_data._M_elems[4] = 0xf2;
    local_58.m_data._M_elems[5] = 0xf3;
    local_58.m_data._M_elems[6] = 0xcd;
    local_58.m_data._M_elems[7] = 0xc6;
    local_58.m_data._M_elems[8] = 0xa6;
    local_58.m_data._M_elems[9] = 0xe5;
    local_58.m_data._M_elems[10] = 'U';
    local_58.m_data._M_elems[0xb] = 'i';
    local_58.m_data._M_elems[0xc] = 0xdc;
    local_58.m_data._M_elems[0xd] = '\x16';
    local_58.m_data._M_elems[0xe] = 'T';
    local_58.m_data._M_elems[0xf] = 0xe1;
    local_58.m_data._M_elems[0x10] = 0xf2;
    local_58.m_data._M_elems[0x11] = '\x19';
    local_58.m_data._M_elems[0x12] = 0x84;
    local_58.m_data._M_elems[0x13] = '\x7f';
    local_58.m_data._M_elems[0x14] = 'f';
    local_58.m_data._M_elems[0x15] = 0xe7;
    local_58.m_data._M_elems[0x16] = '&';
    local_58.m_data._M_elems[0x17] = 0xdc;
    local_58.m_data._M_elems[0x18] = 0xa2;
    local_58.m_data._M_elems[0x19] = 'q';
    local_58.m_data._M_elems[0x1a] = '\x02';
    local_58.m_data._M_elems[0x1b] = '\0';
    local_58.m_data._M_elems[0x1c] = '\0';
    local_58.m_data._M_elems[0x1d] = '\0';
    local_58.m_data._M_elems[0x1e] = '\0';
    local_58.m_data._M_elems[0x1f] = '\0';
    bVar1 = operator==(&local_38,&local_58);
    bVar2 = true;
    if (bVar1) goto LAB_00376c58;
    iVar3 = block_index->nHeight;
  }
  if (iVar3 == 0x166a4) {
    CBlockIndex::GetBlockHash((uint256 *)&local_78,block_index);
    local_98.m_data._M_elems[0] = '/';
    local_98.m_data._M_elems[1] = 'o';
    local_98.m_data._M_elems[2] = '0';
    local_98.m_data._M_elems[3] = 0xf9;
    local_98.m_data._M_elems[4] = 0xd6;
    local_98.m_data._M_elems[5] = 0x83;
    local_98.m_data._M_elems[6] = 0xde;
    local_98.m_data._M_elems[7] = 0xb8;
    local_98.m_data._M_elems[8] = ']';
    local_98.m_data._M_elems[9] = 0x93;
    local_98.m_data._M_elems[10] = '\x14';
    local_98.m_data._M_elems[0xb] = 0xef;
    local_98.m_data._M_elems[0xc] = ']';
    local_98.m_data._M_elems[0xd] = 0xcf;
    local_98.m_data._M_elems[0xe] = '6';
    local_98.m_data._M_elems[0xf] = 0xaf;
    local_98.m_data._M_elems[0x10] = 'f';
    local_98.m_data._M_elems[0x11] = 0xd9;
    local_98.m_data._M_elems[0x12] = 0xe3;
    local_98.m_data._M_elems[0x13] = 0xce;
    local_98.m_data._M_elems[0x14] = '\x1a';
    local_98.m_data._M_elems[0x15] = '+';
    local_98.m_data._M_elems[0x16] = 'y';
    local_98.m_data._M_elems[0x17] = 0xd4;
    local_98.m_data._M_elems[0x18] = 0xae;
    local_98.m_data._M_elems[0x19] = 0xf0;
    local_98.m_data._M_elems[0x1a] = '\n';
    local_98.m_data._M_elems[0x1b] = '\0';
    local_98.m_data._M_elems[0x1c] = '\0';
    local_98.m_data._M_elems[0x1d] = '\0';
    local_98.m_data._M_elems[0x1e] = '\0';
    local_98.m_data._M_elems[0x1f] = '\0';
    bVar2 = operator==(&local_78,&local_98);
  }
  else {
    bVar2 = false;
  }
LAB_00376c58:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Unspendable(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91722 && block_index.GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
           (block_index.nHeight==91812 && block_index.GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"});
}